

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O3

void __thiscall
kratos::Simulator::set_value_(Simulator *this,Var *var,optional<unsigned_long> op_value)

{
  unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *this_00;
  VarType VVar1;
  void *pvVar2;
  pointer puVar3;
  ulong *puVar4;
  ulong uVar5;
  char cVar6;
  pointer ppVar7;
  int iVar8;
  uint uVar9;
  const_iterator __end5;
  iterator iVar10;
  undefined4 extraout_var;
  mapped_type *pmVar11;
  iterator iVar12;
  pair<unsigned_int,_unsigned_int> pVar13;
  _Storage<unsigned_long,_true> *p_Var14;
  UserException *pUVar15;
  InternalException *pIVar16;
  byte bVar17;
  pointer puVar18;
  _Storage<unsigned_long,_true> _Var19;
  size_type __n;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  byte bVar23;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<unsigned_long> __l;
  Var *local_c8;
  pointer ppStack_c0;
  _Storage<unsigned_long,_true> _Stack_b8;
  vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> values;
  undefined1 local_98 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  changed_bits;
  Var *var_local;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  index;
  Var *local_38;
  Var *root;
  
  _Var19._M_value =
       op_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  if (((undefined1  [16])
       op_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0
     ) {
    puVar18 = (var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    changed_bits._M_h._M_single_bucket = (__node_base_ptr)var;
    if (((long)(var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)puVar18 == 4) && (*puVar18 == 1)) {
      VVar1 = var->type_;
      if (VVar1 != Slice) {
        if ((VVar1 != Parameter) && (VVar1 != ConstValue)) {
          local_98 = (undefined1  [8])&changed_bits._M_h._M_rehash_policy._M_next_resize;
          changed_bits._M_h._M_buckets = (__buckets_ptr)0x1;
          changed_bits._M_h._M_bucket_count = 0;
          changed_bits._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          changed_bits._M_h._M_element_count._0_4_ = 0x3f800000;
          changed_bits._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          changed_bits._M_h._M_rehash_policy._4_4_ = 0;
          changed_bits._M_h._M_rehash_policy._M_next_resize = 0;
          iVar10 = std::
                   _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)this,(key_type *)&changed_bits._M_h._M_single_bucket);
          if (iVar10.
              super__Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false>.
              _M_cur == (__node_type *)0x0) {
            p_Var14 = (_Storage<unsigned_long,_true> *)
                      std::__detail::
                      _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this,(key_type *)&changed_bits._M_h._M_single_bucket);
            p_Var14->_M_value = (unsigned_long)_Var19;
            uVar20 = 0;
            while( true ) {
              var_local = (Var *)CONCAT44(var_local._4_4_,uVar20);
              uVar9 = (*(code *)(changed_bits._M_h._M_single_bucket)->_M_nxt[7]._M_nxt)();
              if (uVar9 <= uVar20) break;
              std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::_M_emplace<unsigned_int&>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)local_98,&var_local);
              uVar20 = (int)var_local + 1;
            }
          }
          else {
            iVar10 = std::
                     _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)this,(key_type *)&changed_bits._M_h._M_single_bucket);
            if (iVar10.
                super__Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
            }
            pvVar2 = *(void **)((long)iVar10.
                                      super__Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false>
                                      ._M_cur + 0x10);
            if (pvVar2 != (void *)_Var19._M_value) {
              p_Var14 = (_Storage<unsigned_long,_true> *)
                        std::__detail::
                        _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)this,(key_type *)&changed_bits._M_h._M_single_bucket);
              p_Var14->_M_value = (unsigned_long)_Var19;
              uVar20 = 0;
              while( true ) {
                var_local = (Var *)CONCAT44(var_local._4_4_,uVar20);
                uVar9 = (*(code *)(changed_bits._M_h._M_single_bucket)->_M_nxt[7]._M_nxt)();
                if (uVar9 <= uVar20) break;
                if ((((ulong)pvVar2 ^ _Var19._M_value) >> ((ulong)var_local & 0x3f) & 1) != 0) {
                  std::
                  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::_M_emplace<unsigned_int&>
                            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)local_98,&var_local);
                }
                uVar20 = (int)var_local + 1;
              }
            }
          }
          trigger_event(this,(Var *)changed_bits._M_h._M_single_bucket,
                        (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)local_98);
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)local_98);
          return;
        }
        pUVar15 = (UserException *)__cxa_allocate_exception(0x10);
        (*(var->super_IRNode)._vptr_IRNode[0x20])(&var_local,var);
        _Stack_b8 = (_Storage<unsigned_long,_true>)var_local;
        values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)index.
                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        format_str.size_ = 0xd;
        format_str.data_ = (char *)0x21;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&_Stack_b8;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)local_98,(detail *)"Cannot set value for constant {0}",format_str,args)
        ;
        UserException::UserException(pUVar15,(string *)local_98);
        __cxa_throw(pUVar15,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar8 = (*(var->super_IRNode)._vptr_IRNode[0x28])(var);
      local_38 = (Var *)CONCAT44(extraout_var,iVar8);
      _Stack_b8._M_value = 0;
      values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((local_38->type_ == Parameter) || (local_38->type_ == ConstValue)) {
        pUVar15 = (UserException *)__cxa_allocate_exception(0x10);
        (*(var->super_IRNode)._vptr_IRNode[0x20])(&var_local,var);
        local_c8 = var_local;
        ppStack_c0 = index.
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        format_str_00.size_ = 0xd;
        format_str_00.data_ = (char *)0x21;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&local_c8;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)local_98,(detail *)"Cannot set value for constant {0}",format_str_00,
                   args_00);
        UserException::UserException(pUVar15,(string *)local_98);
        __cxa_throw(pUVar15,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
      puVar18 = (local_38->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar3 = (local_38->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (((long)puVar3 - (long)puVar18 == 4) && (*puVar18 == 1)) {
        iVar10 = std::
                 _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)this,&local_38);
        if (iVar10.
            super__Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false>.
            _M_cur == (__node_type *)0x0) {
          pmVar11 = std::__detail::
                    _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)this,&local_38);
          *pmVar11 = 0;
        }
        local_98 = (undefined1  [8])
                   std::
                   unordered_map<const_kratos::Var_*,_unsigned_long,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>_>
                   ::at(&this->values_,&local_38);
        std::vector<unsigned_long*,std::allocator<unsigned_long*>>::
        _M_assign_aux<unsigned_long*const*>
                  ((vector<unsigned_long*,std::allocator<unsigned_long*>> *)&_Stack_b8,local_98);
      }
      else {
        __n = 1;
        for (; iVar8 = (int)__n, puVar18 != puVar3; puVar18 = puVar18 + 1) {
          __n = (size_type)(iVar8 * *puVar18);
        }
        this_00 = &this->complex_values_;
        iVar12 = std::
                 _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&this_00->_M_h,&local_38);
        if (iVar12.
            super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_98,__n,
                     (allocator_type *)&var_local);
          if (iVar8 != 0) {
            memset((void *)local_98,0,__n * 8);
          }
          std::
          _Hashtable<kratos::Var_const*,std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<kratos::Var_const*&,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                    ((_Hashtable<kratos::Var_const*,std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)this_00,&local_38,local_98);
          if (local_98 != (undefined1  [8])0x0) {
            operator_delete((void *)local_98,changed_bits._M_h._M_bucket_count - (long)local_98);
          }
        }
        iVar12 = std::
                 _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&this_00->_M_h,&local_38);
        if (iVar12.
            super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::reserve
                  ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)&_Stack_b8,__n);
        if (iVar8 != 0) {
          lVar22 = 0;
          do {
            local_98 = (undefined1  [8])
                       (*(long *)((long)iVar12.
                                        super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                                        ._M_cur + 0x10) + lVar22);
            std::vector<unsigned_long*,std::allocator<unsigned_long*>>::emplace_back<unsigned_long*>
                      ((vector<unsigned_long*,std::allocator<unsigned_long*>> *)&_Stack_b8,
                       (unsigned_long **)local_98);
            lVar22 = lVar22 + 8;
          } while (__n << 3 != lVar22);
        }
      }
      get_slice_index((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&var_local,this,(Var *)changed_bits._M_h._M_single_bucket);
      if (var_local ==
          (Var *)index.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
        pIVar16 = (InternalException *)__cxa_allocate_exception(0x10);
        local_98 = (undefined1  [8])&changed_bits._M_h._M_bucket_count;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Empty slice","");
        InternalException::InternalException(pIVar16,(string *)local_98);
        __cxa_throw(pIVar16,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      pVar13 = compute_var_high_low
                         (local_38,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                    *)&var_local);
      uVar20 = (*(local_38->super_IRNode)._vptr_IRNode[7])();
      if (uVar20 < (pVar13.first - pVar13.second) + 1) {
        pIVar16 = (InternalException *)__cxa_allocate_exception(0x10);
        local_98 = (undefined1  [8])&changed_bits._M_h._M_bucket_count;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_98,"Unable to resolve variable slicing","");
        InternalException::InternalException(pIVar16,(string *)local_98);
        __cxa_throw(pIVar16,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar20 = local_38->var_width_;
      uVar5 = ((ulong)pVar13 >> 0x20) / (ulong)uVar20;
      uVar9 = 0;
      cVar6 = (char)pVar13.first - (char)uVar20 * (char)uVar5;
      puVar4 = *(ulong **)(_Stack_b8._M_value + uVar5 * 8);
      bVar17 = (byte)(((ulong)pVar13 >> 0x20) % (ulong)uVar20);
      uVar5 = *puVar4;
      bVar23 = (cVar6 - bVar17) + 1;
      uVar21 = ((_Var19._M_value << (bVar23 & 0x3f)) >> (bVar23 & 0x3f)) << (bVar17 & 0x3f) |
               ~((0xffffffffffffffffU >> (cVar6 + 1U & 0x3f)) >> (bVar17 & 0x3f)) & uVar5;
      *puVar4 = uVar21;
      if (uVar21 != uVar5) {
        local_98 = (undefined1  [8])&changed_bits._M_h._M_rehash_policy._M_next_resize;
        changed_bits._M_h._M_buckets = (__buckets_ptr)0x1;
        changed_bits._M_h._M_bucket_count = 0;
        changed_bits._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        changed_bits._M_h._M_element_count._0_4_ = 0x3f800000;
        changed_bits._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        changed_bits._M_h._M_rehash_policy._4_4_ = 0;
        changed_bits._M_h._M_rehash_policy._M_next_resize = 0;
        while( true ) {
          local_c8 = (Var *)CONCAT44(local_c8._4_4_,uVar9);
          uVar20 = (*(local_38->super_IRNode)._vptr_IRNode[7])();
          if (uVar20 <= uVar9) break;
          if (((uVar21 ^ uVar5) >> ((ulong)local_c8 & 0x3f) & 1) != 0) {
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::_M_emplace<unsigned_int&>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_98,&local_c8);
          }
          uVar9 = (int)local_c8 + 1;
        }
        trigger_event(this,local_38,
                      (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)local_98);
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_98);
      }
      _Var19 = _Stack_b8;
      ppVar7 = (pointer)values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
      if (var_local != (Var *)0x0) {
        operator_delete(var_local,
                        (long)index.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)var_local);
        _Var19 = _Stack_b8;
        ppVar7 = (pointer)values.
                          super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else {
      __l._M_len = 1;
      __l._M_array = (iterator)&_Stack_b8;
      _Stack_b8._M_value = _Var19._M_value;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&var_local,__l,
                 (allocator_type *)&local_c8);
      local_98 = (undefined1  [8])var_local;
      changed_bits._M_h._M_buckets =
           (__buckets_ptr)
           index.
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      changed_bits._M_h._M_bucket_count =
           (size_type)
           index.
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      var_local = (Var *)0x0;
      index.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      index.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      changed_bits._M_h._M_before_begin._M_nxt._0_1_ = 1;
      set_complex_value_(this,var,(optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)local_98);
      _Var19 = (_Storage<unsigned_long,_true>)var_local;
      ppVar7 = index.
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (((char)changed_bits._M_h._M_before_begin._M_nxt == '\x01') &&
         (changed_bits._M_h._M_before_begin._M_nxt =
               changed_bits._M_h._M_before_begin._M_nxt & 0xffffffffffffff00,
         local_98 != (undefined1  [8])0x0)) {
        operator_delete((void *)local_98,changed_bits._M_h._M_bucket_count - (long)local_98);
        _Var19 = (_Storage<unsigned_long,_true>)var_local;
        ppVar7 = index.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    if ((void *)_Var19._M_value != (void *)0x0) {
      operator_delete((void *)_Var19,(long)ppVar7 - (long)_Var19);
    }
  }
  return;
}

Assistant:

void Simulator::set_value_(const kratos::Var *var, std::optional<uint64_t> op_value) {
    if (!op_value) return;
    auto value = *op_value;
    if (var->size().size() != 1 || var->size().front() != 1) {
        set_complex_value_(var, std::vector<uint64_t>{value});
        return;
    }
    if (var->type() == VarType::Parameter || var->type() == VarType::ConstValue) {
        throw UserException(::format("Cannot set value for constant {0}", var->handle_name()));
    } else if (var->type() == VarType::Slice) {
        auto const *root = var->get_var_root_parent();
        std::vector<uint64_t *> values;
        if (root->type() == VarType::ConstValue || root->type() == VarType::Parameter) {
            throw UserException(::format("Cannot set value for constant {0}", var->handle_name()));
        } else if (root->size().size() == 1 && root->size().front() == 1) {
            // this is size one
            if (values_.find(root) == values_.end()) values_[root] = 0;
            values = {&values_.at(root)};
        } else {
            uint32_t base = 1;
            for (uint32_t s : root->size()) {
                base *= s;
            }
            if (complex_values_.find(root) == complex_values_.end()) {
                // fill in values
                std::vector<uint64_t> v(base);
                for (uint64_t i = 0; i < base; i++) v[i] = 0;
                complex_values_.emplace(root, v);
            }
            std::vector<uint64_t> &v_ref = complex_values_.at(root);
            values.reserve(base);
            for (uint64_t i = 0; i < base; i++) values.emplace_back(&v_ref[i]);
        }
        // obtain the index
        auto index = get_slice_index(var);
        if (index.empty()) throw InternalException("Empty slice");
        auto [var_high, var_low] = compute_var_high_low(root, index);
        if (var_high + 1 - var_low > root->width())
            throw InternalException("Unable to resolve variable slicing");
        auto base = var_low / root->var_width();
        var_high = var_high - base * root->var_width();
        var_low = var_low - base * root->var_width();
        auto *v = values[base];
        auto temp = *v;
        // compute the mask
        uint64_t mask = (0xFFFFFFFFFFFFFFFF >> (var_high + 1)) >> var_low;
        *v = *v & (~mask);
        value = value & (0xFFFFFFFFFFFFFFFF >> (var_high - var_low + 1));
        *v = *v | (value << var_low);
        if (*v != temp) {
            std::unordered_set<uint32_t> changed_bits;
            uint64_t m = (*v) ^ temp;
            for (uint32_t bit = 0; bit < root->width(); bit++) {
                if ((m >> bit) & 1u) {
                    changed_bits.emplace(bit);
                }
            }
            trigger_event(root, changed_bits);
        }
    } else {
        std::unordered_set<uint32_t> changed_bits;
        if (values_.find(var) != values_.end()) {
            auto temp = values_.at(var);
            if (temp != value) {
                values_[var] = value;
                uint64_t m = value ^ temp;
                for (uint32_t bit = 0; bit < var->width(); bit++) {
                    if ((m >> bit) & 1u) {
                        changed_bits.emplace(bit);
                    }
                }
            }
        } else {
            values_[var] = value;
            for (uint32_t i = 0; i < var->width(); i++) changed_bits.emplace(i);
        }
        trigger_event(var, changed_bits);
    }
}